

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::TempVarName_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this,Index n)

{
  string local_40;
  Index local_1c;
  Decompiler *pDStack_18;
  Index n_local;
  Decompiler *this_local;
  
  local_1c = n;
  pDStack_18 = this;
  this_local = (Decompiler *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_40,n);
  std::operator+(__return_storage_ptr__,"t",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string TempVarName(Index n) {
    // FIXME: this needs much better variable naming. Problem is, the code
    // in generate-names.cc has allready run, its dictionaries deleted, so it
    // is not easy to integrate with it.
    return "t" + std::to_string(n);
  }